

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool ContextualCheckBlockHeader
               (CBlockHeader *block,BlockValidationState *state,BlockManager *blockman,
               ChainstateManager *chainman,CBlockIndex *pindexPrev)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  CBlockIndex *pCVar4;
  int64_t iVar5;
  ulong uVar6;
  time_point tVar7;
  CChainParams *pCVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int nHeight;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
    __assert_fail("pindexPrev != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1039,
                  "bool ContextualCheckBlockHeader(const CBlockHeader &, BlockValidationState &, BlockManager &, const ChainstateManager &, const CBlockIndex *)"
                 );
  }
  lVar10 = (long)pindexPrev->nHeight + 1;
  iVar9 = (int)lVar10;
  pCVar8 = (chainman->m_options).chainparams;
  uVar1 = block->nBits;
  nHeight = iVar9;
  uVar3 = GetNextWorkRequired(pindexPrev,block,&pCVar8->consensus);
  if (uVar1 == uVar3) {
    if ((((chainman->m_options).checkpoints_enabled == true) &&
        (pCVar4 = node::BlockManager::GetLastCheckpoint
                            (blockman,&((chainman->m_options).chainparams)->checkpointData),
        pCVar4 != (CBlockIndex *)0x0)) && (iVar9 < pCVar4->nHeight)) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ContextualCheckBlockHeader";
      logging_function._M_len = 0x1a;
      LogPrintFormatInternal<char[27],int>
                (logging_function,source_file,0x1048,ALL,Info,(ConstevalFormatString<2U>)0xfb5bf8,
                 (char (*) [27])"ContextualCheckBlockHeader",&nHeight);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"bad-fork-prior-to-checkpoint","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CHECKPOINT,
                         &local_58,&local_78);
      goto LAB_00ae33c4;
    }
    uVar1 = block->nTime;
    iVar5 = CBlockIndex::GetMedianTimePast(pindexPrev);
    if ((long)(ulong)uVar1 <= iVar5) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"time-too-old","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"block\'s timestamp is too early","");
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                         &local_58,&local_78);
      goto LAB_00ae33c4;
    }
    if ((pCVar8->consensus).enforce_BIP94 == false) {
      uVar6 = (ulong)block->nTime;
    }
    else {
      uVar6 = (ulong)block->nTime;
      if ((lVar10 % ((pCVar8->consensus).nPowTargetTimespan / (pCVar8->consensus).nPowTargetSpacing)
           == 0) && ((long)uVar6 < (long)((ulong)pindexPrev->nTime - 600))) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"time-timewarp-attack","");
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"block\'s timestamp is too early on diff adjustment block",""
                  );
        bVar2 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER
                           ,&local_58,&local_78);
        goto LAB_00ae33c4;
      }
    }
    tVar7 = NodeClock::now();
    if (uVar6 * 1000000000 - ((long)tVar7.__d.__r + 7200000000000) != 0 &&
        (long)tVar7.__d.__r + 7200000000000 <= (long)(uVar6 * 1000000000)) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"time-too-new","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"block timestamp too far in the future","");
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_TIME_FUTURE,
                         &local_58,&local_78);
      goto LAB_00ae33c4;
    }
    uVar1 = block->nVersion;
    if ((int)uVar1 < 2) {
      pCVar8 = (chainman->m_options).chainparams;
      iVar9 = pindexPrev->nHeight + 1;
      if (iVar9 < (pCVar8->consensus).BIP34Height) {
LAB_00ae344b:
        if (iVar9 < (pCVar8->consensus).BIP66Height) goto LAB_00ae346a;
      }
    }
    else {
      if (uVar1 == 2) {
        pCVar8 = (chainman->m_options).chainparams;
        iVar9 = pindexPrev->nHeight + 1;
        goto LAB_00ae344b;
      }
      bVar2 = true;
      if (3 < uVar1) goto LAB_00ae33f4;
      pCVar8 = (chainman->m_options).chainparams;
      iVar9 = pindexPrev->nHeight + 1;
LAB_00ae346a:
      bVar2 = true;
      if (iVar9 < (pCVar8->consensus).BIP65Height) goto LAB_00ae33f4;
    }
    tinyformat::format<int>(&local_58,"bad-version(0x%08x)",&block->nVersion);
    tinyformat::format<int>(&local_78,"rejected nVersion=0x%08x block",&block->nVersion);
    bVar2 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                       &local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00ae33f4;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"bad-diffbits","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"incorrect proof of work","");
    bVar2 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                       &local_58,&local_78);
LAB_00ae33c4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00ae33f4;
  }
  operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
LAB_00ae33f4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);
    assert(pindexPrev != nullptr);
    const int nHeight = pindexPrev->nHeight + 1;

    // Check proof of work
    const Consensus::Params& consensusParams = chainman.GetConsensus();
    if (block.nBits != GetNextWorkRequired(pindexPrev, &block, consensusParams))
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "bad-diffbits", "incorrect proof of work");

    // Check against checkpoints
    if (chainman.m_options.checkpoints_enabled) {
        // Don't accept any forks from the main chain prior to last checkpoint.
        // GetLastCheckpoint finds the last checkpoint in MapCheckpoints that's in our
        // BlockIndex().
        const CBlockIndex* pcheckpoint = blockman.GetLastCheckpoint(chainman.GetParams().Checkpoints());
        if (pcheckpoint && nHeight < pcheckpoint->nHeight) {
            LogPrintf("ERROR: %s: forked chain older than last checkpoint (height %d)\n", __func__, nHeight);
            return state.Invalid(BlockValidationResult::BLOCK_CHECKPOINT, "bad-fork-prior-to-checkpoint");
        }
    }

    // Check timestamp against prev
    if (block.GetBlockTime() <= pindexPrev->GetMedianTimePast())
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-too-old", "block's timestamp is too early");

    // Testnet4 and regtest only: Check timestamp against prev for difficulty-adjustment
    // blocks to prevent timewarp attacks (see https://github.com/bitcoin/bitcoin/pull/15482).
    if (consensusParams.enforce_BIP94) {
        // Check timestamp for the first block of each difficulty adjustment
        // interval, except the genesis block.
        if (nHeight % consensusParams.DifficultyAdjustmentInterval() == 0) {
            if (block.GetBlockTime() < pindexPrev->GetBlockTime() - MAX_TIMEWARP) {
                return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-timewarp-attack", "block's timestamp is too early on diff adjustment block");
            }
        }
    }

    // Check timestamp
    if (block.Time() > NodeClock::now() + std::chrono::seconds{MAX_FUTURE_BLOCK_TIME}) {
        return state.Invalid(BlockValidationResult::BLOCK_TIME_FUTURE, "time-too-new", "block timestamp too far in the future");
    }

    // Reject blocks with outdated version
    if ((block.nVersion < 2 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB)) ||
        (block.nVersion < 3 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_DERSIG)) ||
        (block.nVersion < 4 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CLTV))) {
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, strprintf("bad-version(0x%08x)", block.nVersion),
                                 strprintf("rejected nVersion=0x%08x block", block.nVersion));
    }

    return true;
}